

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cpp
# Opt level: O2

void __thiscall unittest::UnitTest::TestTrailingComments(UnitTest *this)

{
  mapped_type *this_00;
  mapped_type *pmVar1;
  allocator<char> local_22a;
  allocator<char> local_229;
  key_type local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  Ini<char> ini;
  istringstream ss;
  
  inipp::Ini<char>::Ini(&ini);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,
             "[sec1]\n; line comment\na=2\nb=3 ; trailing comment\nc=4 ; more ; comments ; here",
             (allocator<char> *)&local_208);
  std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)&local_228,_S_in);
  std::__cxx11::string::~string((string *)&local_228);
  inipp::Ini<char>::parse(&ini,(basic_istream<char,_std::char_traits<char>_> *)&ss);
  WriteMessage<char>(&ini);
  Assert::IsTrue(ini.errors.
                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&ini.errors);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,"sec1",(allocator<char> *)&local_208);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            ::at(&ini.sections,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"a",&local_229);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(this_00,&local_228);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"2",&local_22a);
  Assert::AreEqual<std::__cxx11::string>(pmVar1,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"b",&local_229);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(this_00,&local_228);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"3 ; trailing comment",&local_22a);
  Assert::AreEqual<std::__cxx11::string>(pmVar1,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"c",&local_229);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(this_00,&local_228);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"4 ; more ; comments ; here",&local_22a);
  Assert::AreEqual<std::__cxx11::string>(pmVar1,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  inipp::Ini<char>::strip_trailing_comments(&ini);
  WriteMessage<char>(&ini);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"a",&local_229);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(this_00,&local_228);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"2",&local_22a);
  Assert::AreEqual<std::__cxx11::string>(pmVar1,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"b",&local_229);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(this_00,&local_228);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"3",&local_22a);
  Assert::AreEqual<std::__cxx11::string>(pmVar1,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"c",&local_229);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(this_00,&local_228);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"4",&local_22a);
  Assert::AreEqual<std::__cxx11::string>(pmVar1,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
  inipp::Ini<char>::~Ini(&ini);
  return;
}

Assistant:

TEST_METHOD(TestTrailingComments)
		{
			Ini<char> ini;
			std::istringstream ss("[sec1]\n; line comment\na=2\nb=3 ; trailing comment\nc=4 ; more ; comments ; here");
			ini.parse(ss);
			WriteMessage(ini);
			Assert::IsTrue(ini.errors.empty());
			const auto& sec = ini.sections.at("sec1");
			Assert::AreEqual(sec.at("a"), std::string("2"));
			Assert::AreEqual(sec.at("b"), std::string("3 ; trailing comment"));
			Assert::AreEqual(sec.at("c"), std::string("4 ; more ; comments ; here"));
			ini.strip_trailing_comments();
			WriteMessage(ini);
			Assert::AreEqual(sec.at("a"), std::string("2"));
			Assert::AreEqual(sec.at("b"), std::string("3"));
			Assert::AreEqual(sec.at("c"), std::string("4"));
		}